

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

char * id2name(name_map *map,int max,uint id)

{
  int i;
  uint id_local;
  int max_local;
  name_map *map_local;
  
  i = 0;
  while( true ) {
    if (max <= i) {
      return (char *)0x0;
    }
    if (map[i].id == id) break;
    i = i + 1;
  }
  return map[i].name;
}

Assistant:

const char *id2name(const name_map* map, int max, const unsigned int id)
{
	int i;

	for (i = 0; i < max; i++) {
		if (map[i].id == id) {
			return map[i].name;
		}
	}

	// nothing match
	return NULL;
}